

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

exr_result_t
exr_attr_string_init_static_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *v,int32_t len)

{
  exr_result_t eVar1;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (-1 < len) {
    if (v == (char *)0x0) {
      UNRECOVERED_JUMPTABLE = ctxt->report_error;
      pcVar2 = "Invalid static string argument to initialize";
    }
    else {
      if (s != (exr_attr_string_t *)0x0) {
        s->length = 0;
        s->alloc_size = 0;
        s->str = (char *)0x0;
        s->length = len;
        s->str = v;
        return 0;
      }
      UNRECOVERED_JUMPTABLE = ctxt->report_error;
      pcVar2 = "Invalid reference to string object to initialize";
    }
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar2);
    return eVar1;
  }
  eVar1 = (*ctxt->print_error)
                    (ctxt,3,"Received request to allocate negative sized string (%d)",len,
                     ctxt->print_error);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_init_static_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* v, int32_t len)
{
    exr_attr_string_t nil = {0};
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (len < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized string (%d)",
            len);

    if (!v)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid static string argument to initialize");

    if (!s)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string object to initialize");

    *s        = nil;
    s->length = len;
    s->str    = v;
    return EXR_ERR_SUCCESS;
}